

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall CTcStrTemplate::append_tok(CTcStrTemplate *this,CTcToken *tok)

{
  CTcTokenEle *nxt;
  CTcToken *in_RSI;
  CTcTokenEle *in_RDI;
  CTcTokenizer *unaff_retaddr;
  CTcTokenEle *ele;
  CTcPrsMem *in_stack_ffffffffffffffd8;
  CTcTokenEle *dst;
  
  dst = in_RDI;
  nxt = (CTcTokenEle *)operator_new((size_t)in_RDI,in_stack_ffffffffffffffd8);
  CTcTokenEle::CTcTokenEle(in_RDI);
  CTcTokenizer::copytok(unaff_retaddr,&dst->super_CTcToken,in_RSI);
  if ((in_RDI->super_CTcToken).text_ == (char *)0x0) {
    *(CTcTokenEle **)&in_RDI->super_CTcToken = nxt;
  }
  else {
    CTcTokenEle::setnxt((CTcTokenEle *)(in_RDI->super_CTcToken).text_,nxt);
  }
  (in_RDI->super_CTcToken).text_ = (char *)nxt;
  *(int *)&(in_RDI->super_CTcToken).text_len_ = (int)(in_RDI->super_CTcToken).text_len_ + 1;
  return;
}

Assistant:

void CTcStrTemplate::append_tok(const CTcToken *tok)
{
    /* create a new list element for the token */
    CTcTokenEle *ele = new (G_prsmem)CTcTokenEle();
    G_tok->copytok(ele, tok);

    /* add it to the tail of the list */
    if (tail != 0)
        tail->setnxt(ele);
    else
        head = ele;
    tail = ele;

    /* count the token */
    cnt++;
}